

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

RuntimePtr Jinx::CreateRuntime(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Jinx::IRuntime> *in_RDI;
  RuntimePtr RVar1;
  shared_ptr<Jinx::IRuntime> local_38;
  Allocator<Jinx::Impl::Runtime> local_21;
  undefined1 local_20 [8];
  shared_ptr<Jinx::Impl::Runtime> runtime;
  
  Allocator<Jinx::Impl::Runtime>::Allocator(&local_21);
  std::allocate_shared<Jinx::Impl::Runtime,Jinx::Allocator<Jinx::Impl::Runtime>>
            ((Allocator<Jinx::Impl::Runtime> *)local_20);
  std::shared_ptr<Jinx::IRuntime>::shared_ptr<Jinx::Impl::Runtime,void>
            (&local_38,(shared_ptr<Jinx::Impl::Runtime> *)local_20);
  Impl::RegisterLibCore(&local_38);
  std::shared_ptr<Jinx::IRuntime>::~shared_ptr(&local_38);
  std::shared_ptr<Jinx::IRuntime>::shared_ptr<Jinx::Impl::Runtime,void>
            (in_RDI,(shared_ptr<Jinx::Impl::Runtime> *)local_20);
  std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr((shared_ptr<Jinx::Impl::Runtime> *)local_20);
  RVar1.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar1.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (RuntimePtr)RVar1.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t RuntimePtr CreateRuntime()
	{
		auto runtime = std::allocate_shared<Impl::Runtime>(Allocator<Impl::Runtime>());
		Impl::RegisterLibCore(runtime);
		return runtime;
	}